

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_3chan(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  exr_coding_channel_info_t *peVar11;
  ulong uVar12;
  uint8_t *puVar13;
  int iVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  int x;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint8_t *puVar21;
  long lVar22;
  
  pvVar10 = decode->unpacked_buffer;
  peVar11 = decode->channels;
  iVar1 = (decode->chunk).height;
  iVar2 = decode->user_line_end_ignore;
  uVar3 = peVar11->width;
  iVar4 = peVar11->user_pixel_stride;
  iVar5 = peVar11[1].user_pixel_stride;
  iVar6 = peVar11[2].user_pixel_stride;
  iVar7 = peVar11->user_line_stride;
  iVar8 = peVar11[1].user_line_stride;
  iVar9 = peVar11[2].user_line_stride;
  iVar14 = decode->user_line_begin_skip;
  lVar19 = (long)(int)(uVar3 * 6);
  lVar17 = (long)(int)(uVar3 * 6 * iVar14);
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
  }
  lVar20 = lVar17 + (long)pvVar10;
  lVar22 = lVar17 + (long)(int)uVar3 * 2 + (long)pvVar10;
  lVar17 = lVar17 + (long)(int)uVar3 * 4 + (long)pvVar10;
  puVar21 = (peVar11->field_12).decode_to_ptr;
  puVar16 = peVar11[1].field_12.decode_to_ptr;
  puVar15 = peVar11[2].field_12.decode_to_ptr;
  for (; iVar14 < iVar1 - iVar2; iVar14 = iVar14 + 1) {
    puVar13 = puVar21;
    for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
      *(undefined2 *)puVar13 = *(undefined2 *)(lVar20 + uVar18 * 2);
      puVar13 = puVar13 + iVar4;
    }
    puVar13 = puVar16;
    for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
      *(undefined2 *)puVar13 = *(undefined2 *)(lVar22 + uVar18 * 2);
      puVar13 = puVar13 + iVar5;
    }
    puVar13 = puVar15;
    for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
      *(undefined2 *)puVar13 = *(undefined2 *)(lVar17 + uVar18 * 2);
      puVar13 = puVar13 + iVar6;
    }
    lVar20 = lVar20 + lVar19;
    puVar21 = puVar21 + iVar7;
    puVar16 = puVar16 + iVar8;
    puVar15 = puVar15 + iVar9;
    lVar22 = lVar22 + lVar19;
    lVar17 = lVar17 + lVar19;
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             inc0, inc1, inc2;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}